

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispLexer.cpp
# Opt level: O1

void __thiscall
Shell::LispLexer::readQuotedString
          (LispLexer *this,Token *token,char opening,char closing,char escapeChar)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  LexerException *pLVar4;
  int iVar5;
  string local_70;
  string local_50;
  
  bVar1 = Lexer::readNextChar(&this->super_Lexer);
  if (bVar1) {
    iVar5 = (int)closing;
    bVar1 = false;
    do {
      iVar3 = (this->super_Lexer)._lastCharacter;
      bVar2 = true;
      if ((closing == escapeChar || bVar1) || iVar3 != escapeChar) {
        if (iVar3 == iVar5 && !bVar1) {
          if (closing != escapeChar) {
LAB_0070ff51:
            Lexer::saveTokenText(&this->super_Lexer,token);
            Lexer::readNextChar(&this->super_Lexer);
            token->tag = TT_NAME;
            return;
          }
          iVar3 = Lexer::lookAhead(&this->super_Lexer);
          if (iVar3 != iVar5) goto LAB_0070ff51;
          Lexer::readNextChar(&this->super_Lexer);
          bVar2 = bVar1;
        }
        else {
          if (((iVar3 != iVar5) && (iVar3 != escapeChar)) && (bVar1)) {
            pLVar4 = (LexerException *)__cxa_allocate_exception(0x48);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"invalid escape sequence in quoted string ","");
            LexerException::LexerException(pLVar4,&local_50,&this->super_Lexer);
            __cxa_throw(pLVar4,&LexerException::typeinfo,LexerException::~LexerException);
          }
          Lexer::saveLastChar(&this->super_Lexer);
          bVar2 = false;
        }
      }
      bVar1 = bVar2;
      bVar2 = Lexer::readNextChar(&this->super_Lexer);
    } while (bVar2);
  }
  pLVar4 = (LexerException *)__cxa_allocate_exception(0x48);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"file ended while reading quoted string ","");
  LexerException::LexerException(pLVar4,&local_70,&this->super_Lexer);
  __cxa_throw(pLVar4,&LexerException::typeinfo,LexerException::~LexerException);
}

Assistant:

void LispLexer::readQuotedString(Token& token, char opening, char closing, char escapeChar)
{
  bool escape=false;
  // Don't save this char so that the final string doesn't contain the quote symbol
  //saveLastChar();

  while (readNextChar()) {
    if (_lastCharacter == escapeChar && !escape && closing != escapeChar) {
      escape=true;
    }
    else if (_lastCharacter == closing && !escape) {
      if(closing == escapeChar && lookAhead() == closing){
        readNextChar();
      }
      else{
        // Don't save this char so that the final string doesn't contain the quote symbol
        //saveLastChar();
        saveTokenText(token);
        readNextChar();
        token.tag = TT_NAME;
        return;
      }
    }
    else {
      if (escape && _lastCharacter!=closing && _lastCharacter!=escapeChar) {
	throw LexerException((std::string)"invalid escape sequence in quoted string ", *this);
      }
      escape=false;
      saveLastChar();
    }
  }
  throw LexerException((std::string)"file ended while reading quoted string ", *this);
}